

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O3

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories
               (cmXMLWriter *xml,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *includeDirs,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *emittedDirs)

{
  bool bVar1;
  iterator iVar2;
  pointer pbVar3;
  pointer in_relative;
  string dir;
  RegularExpression frameworkRx;
  string local_160;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_140;
  string local_138;
  pointer local_118;
  cmXMLWriter *local_110;
  _Base_ptr local_108;
  RegularExpression local_100;
  
  in_relative = (includeDirs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (includeDirs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (in_relative != pbVar3) {
    local_108 = &(emittedDirs->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_140 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)emittedDirs;
    local_118 = pbVar3;
    local_110 = xml;
    do {
      if (in_relative->_M_string_length != 0) {
        cmsys::SystemTools::CollapseFullPath(&local_138,in_relative);
        local_100.regmatch.startp[0] = (char *)0x0;
        local_100.regmatch.endp[0] = (char *)0x0;
        local_100.regmatch.searchstring = (char *)0x0;
        local_100.program = (char *)0x0;
        cmsys::RegularExpression::compile(&local_100,"(.+/Frameworks)/.+\\.framework/");
        bVar1 = cmsys::RegularExpression::find
                          (&local_100,local_138._M_dataplus._M_p,&local_100.regmatch);
        if (bVar1) {
          if (local_100.regmatch.startp[1] == (char *)0x0) {
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            local_160._M_string_length = 0;
            local_160.field_2._M_local_buf[0] = '\0';
          }
          else {
            local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_160,local_100.regmatch.startp[1],local_100.regmatch.endp[1])
            ;
          }
          std::__cxx11::string::operator=((string *)&local_138,(string *)&local_160);
          xml = local_110;
          pbVar3 = local_118;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,
                            CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                     local_160.field_2._M_local_buf[0]) + 1);
            xml = local_110;
            pbVar3 = local_118;
          }
        }
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_140,&local_138);
        if (iVar2._M_node == local_108) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(local_140,&local_138);
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"pathentry","");
          cmXMLWriter::StartElement(xml,&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,
                            CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                     local_160.field_2._M_local_buf[0]) + 1);
          }
          local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_160,local_138._M_dataplus._M_p,
                     local_138._M_dataplus._M_p + local_138._M_string_length);
          cmXMLWriter::Attribute<std::__cxx11::string>(xml,"include",&local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,
                            CONCAT71(local_160.field_2._M_allocated_capacity._1_7_,
                                     local_160.field_2._M_local_buf[0]) + 1);
          }
          cmXMLWriter::Attribute<char[4]>(xml,"kind",(char (*) [4])0x534d09);
          cmXMLWriter::Attribute<char[1]>(xml,"path",(char (*) [1])0x54faae);
          cmXMLWriter::Attribute<char[5]>(xml,"system",(char (*) [5])0x5699d9);
          cmXMLWriter::EndElement(xml);
        }
        if (local_100.program != (char *)0x0) {
          operator_delete__(local_100.program);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      in_relative = in_relative + 1;
    } while (in_relative != pbVar3);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::AppendIncludeDirectories(
  cmXMLWriter& xml, const std::vector<std::string>& includeDirs,
  std::set<std::string>& emittedDirs)
{
  for (std::string const& inc : includeDirs) {
    if (!inc.empty()) {
      std::string dir = cmSystemTools::CollapseFullPath(inc);

      // handle framework include dirs on OSX, the remainder after the
      // Frameworks/ part has to be stripped
      //   /System/Library/Frameworks/GLUT.framework/Headers
      cmsys::RegularExpression frameworkRx("(.+/Frameworks)/.+\\.framework/");
      if (frameworkRx.find(dir)) {
        dir = frameworkRx.match(1);
      }

      if (emittedDirs.find(dir) == emittedDirs.end()) {
        emittedDirs.insert(dir);
        xml.StartElement("pathentry");
        xml.Attribute("include",
                      cmExtraEclipseCDT4Generator::GetEclipsePath(dir));
        xml.Attribute("kind", "inc");
        xml.Attribute("path", "");
        xml.Attribute("system", "true");
        xml.EndElement();
      }
    }
  }
}